

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11_object_dealloc(PyObject *self)

{
  PyTypeObject *op;
  internals *piVar1;
  PyTypeObject *pybind11_object_type;
  PyTypeObject *type;
  PyObject *self_local;
  
  pybind11::detail::clear_instance(self);
  op = self->ob_type;
  (*op->tp_free)(self);
  piVar1 = pybind11::detail::get_internals();
  if (op->tp_dealloc == (destructor)piVar1->instance_base[3].ob_refcnt) {
    _Py_DECREF((PyObject *)op);
  }
  return;
}

Assistant:

inline void pybind11_object_dealloc(PyObject *self) {
    clear_instance(self);

    auto type = Py_TYPE(self);
    type->tp_free(self);

    // `type->tp_dealloc != pybind11_object_dealloc` means that we're being called
    // as part of a derived type's dealloc, in which case we're not allowed to decref
    // the type here. For cross-module compatibility, we shouldn't compare directly
    // with `pybind11_object_dealloc`, but with the common one stashed in internals.
    auto pybind11_object_type = (PyTypeObject *) get_internals().instance_base;
    if (type->tp_dealloc == pybind11_object_type->tp_dealloc)
        Py_DECREF(type);
}